

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.hpp
# Opt level: O3

string * toHexString_abi_cxx11_(string *__return_storage_ptr__,uint8_t *pData,size_t size)

{
  long lVar1;
  size_t sVar2;
  stringstream ss;
  stringstream asStack_1b8 [16];
  long local_1a8 [2];
  undefined8 uStack_198;
  uint auStack_190 [22];
  ios_base local_138 [112];
  char acStack_c8 [152];
  
  std::__cxx11::stringstream::stringstream(asStack_1b8);
  if (size != 0) {
    sVar2 = 0;
    do {
      *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
           *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 8;
      *(undefined8 *)((long)&uStack_198 + *(long *)(local_1a8[0] + -0x18)) = 2;
      lVar1 = *(long *)(local_1a8[0] + -0x18);
      if (acStack_c8[lVar1 + 1] == '\0') {
        std::ios::widen((char)local_1a8 + (char)lVar1);
        acStack_c8[lVar1 + 1] = '\x01';
      }
      acStack_c8[lVar1] = '0';
      std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      sVar2 = sVar2 + 1;
    } while (size != sVar2);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

inline std::string toHexString(const uint8_t* pData, size_t size)
{
    std::stringstream ss;;
    for (size_t i=0; i<size; i++)
    {
        ss << std::hex << std::setw(2) << std::setfill('0') << unsigned(pData[i]);
    }

    return ss.str();
}